

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.h
# Opt level: O0

pair<const_HighsCliqueTable::CliqueVar_*,_int> __thiscall
HighsCliqueTable::findCommonClique(HighsCliqueTable *this,CliqueVar v1,CliqueVar v2)

{
  bool bVar1;
  HighsInt HVar2;
  reference pvVar3;
  CliqueVar *in_RDI;
  pair<const_HighsCliqueTable::CliqueVar_*,_int> pVar4;
  HighsInt clq;
  pair<const_HighsCliqueTable::CliqueVar_*,_int> c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  HighsInt HVar5;
  int local_2c;
  void *local_28 [3];
  pair<const_HighsCliqueTable::CliqueVar_*,_int> local_10;
  
  local_28[0] = (void *)0x0;
  local_2c = 0;
  std::pair<const_HighsCliqueTable::CliqueVar_*,_int>::pair<std::nullptr_t,_int,_true>
            (&local_10,local_28,&local_2c);
  bVar1 = CliqueVar::operator==
                    (in_RDI,(CliqueVar *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if ((!bVar1) &&
     (HVar2 = findCommonCliqueId((HighsCliqueTable *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 SUB84((ulong)in_RDI >> 0x20,0),SUB84(in_RDI,0)), HVar2 != -1)) {
    pvVar3 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         *)(in_RDI + 0x2e),(long)HVar2);
    local_10.first =
         std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
         operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     *)in_RDI,(long)pvVar3->start);
    pvVar3 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         *)(in_RDI + 0x2e),(long)HVar2);
    HVar5 = pvVar3->end;
    pvVar3 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         *)(in_RDI + 0x2e),(long)HVar2);
    local_10.second = HVar5 - pvVar3->start;
  }
  pVar4.second = local_10.second;
  pVar4.first = local_10.first;
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

std::pair<const CliqueVar*, HighsInt> findCommonClique(CliqueVar v1,
                                                         CliqueVar v2) {
    std::pair<const CliqueVar*, HighsInt> c{nullptr, 0};
    if (v1 == v2) return c;
    HighsInt clq = findCommonCliqueId(v1, v2);
    if (clq == -1) return c;

    c.first = &cliqueentries[cliques[clq].start];
    c.second = cliques[clq].end - cliques[clq].start;
    return c;
  }